

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.hpp
# Opt level: O1

void __thiscall
duckdb_jaro_winkler::CachedJaroSimilarity<char>::
CachedJaroSimilarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (CachedJaroSimilarity<char> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first1,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 last1)

{
  (this->s1)._M_dataplus._M_p = (pointer)&(this->s1).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ();
  common::BlockPatternMatchVector::
  BlockPatternMatchVector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&this->PM,first1,last1);
  return;
}

Assistant:

CachedJaroSimilarity(InputIt1 first1, InputIt1 last1) : s1(first1, last1), PM(first1, last1)
    {}